

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O1

pair<int,_int>
calcSup(vector<SoftNode,_std::allocator<SoftNode>_> *sc1,
       vector<SoftNode,_std::allocator<SoftNode>_> *sc2)

{
  pointer pSVar1;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  pair<int,_int> pVar5;
  pointer pSVar6;
  SoftNode sn;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  st2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  st1;
  int local_124;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined2 local_a8;
  vector<SoftNode,_std::allocator<SoftNode>_> *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar6 = (sc1->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (sc1->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = sc2;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pSVar6 != pSVar1) {
    do {
      pcVar2 = (pSVar6->refName)._M_dataplus._M_p;
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar2,pcVar2 + (pSVar6->refName)._M_string_length);
      pcVar2 = (pSVar6->seq)._M_dataplus._M_p;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar2,pcVar2 + (pSVar6->seq)._M_string_length);
      pcVar2 = (pSVar6->readName)._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + (pSVar6->readName)._M_string_length);
      local_a8._0_1_ = pSVar6->scAtRight;
      local_a8._1_1_ = pSVar6->isSC;
      if (local_a8._1_1_ == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,&local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar1);
  }
  pSVar6 = (local_98->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (local_98->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar1) {
    do {
      pcVar2 = (pSVar6->refName)._M_dataplus._M_p;
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar2,pcVar2 + (pSVar6->refName)._M_string_length);
      pcVar2 = (pSVar6->seq)._M_dataplus._M_p;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar2,pcVar2 + (pSVar6->seq)._M_string_length);
      pcVar2 = (pSVar6->readName)._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + (pSVar6->readName)._M_string_length);
      local_a8._0_1_ = pSVar6->scAtRight;
      local_a8._1_1_ = pSVar6->isSC;
      if (local_a8._1_1_ == '\0') {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_90,&local_c8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar1);
  }
  pSVar6 = (sc1->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (sc1->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 == pSVar1) {
    iVar3 = 0;
    local_124 = 0;
  }
  else {
    local_124 = 0;
    iVar3 = 0;
    do {
      pcVar2 = (pSVar6->refName)._M_dataplus._M_p;
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar2,pcVar2 + (pSVar6->refName)._M_string_length);
      pcVar2 = (pSVar6->seq)._M_dataplus._M_p;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar2,pcVar2 + (pSVar6->seq)._M_string_length);
      pcVar2 = (pSVar6->readName)._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + (pSVar6->readName)._M_string_length);
      local_a8._0_1_ = pSVar6->scAtRight;
      local_a8._1_1_ = pSVar6->isSC;
      if (local_a8._1_1_ == '\x01') {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_90,&local_c8);
        if ((_Rb_tree_header *)iVar4._M_node == &local_90._M_impl.super__Rb_tree_header) {
          iVar3 = iVar3 + 1;
        }
        else {
          local_124 = local_124 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar1);
  }
  pSVar6 = (local_98->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar1 = (local_98->super__Vector_base<SoftNode,_std::allocator<SoftNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar1) {
    do {
      pcVar2 = (pSVar6->refName)._M_dataplus._M_p;
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,pcVar2,pcVar2 + (pSVar6->refName)._M_string_length);
      pcVar2 = (pSVar6->seq)._M_dataplus._M_p;
      local_e8[0] = local_d8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,pcVar2,pcVar2 + (pSVar6->seq)._M_string_length);
      pcVar2 = (pSVar6->readName)._M_dataplus._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar2,pcVar2 + (pSVar6->readName)._M_string_length);
      local_a8._0_1_ = pSVar6->scAtRight;
      local_a8._1_1_ = pSVar6->isSC;
      if (local_a8._1_1_ == '\x01') {
        iVar4 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&local_c8);
        if ((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) {
          iVar3 = iVar3 + 1;
        }
        else {
          local_124 = local_124 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0]);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0]);
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar1);
  }
  pVar5.second = iVar3;
  pVar5.first = local_124;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return pVar5;
}

Assistant:

std::pair<int, int> calcSup(const std::vector<SoftNode> &sc1, const std::vector<SoftNode> &sc2)
{
	std::set<std::string> st1, st2;
	for (SoftNode sn : sc1)
	{
		if (!sn.isSC)
			st1.insert(sn.readName);
	}
	for (SoftNode sn : sc2)
	{
		if (!sn.isSC)
			st2.insert(sn.readName);
	}
	int srCo = 0, scCo = 0;
	for (SoftNode sn : sc1)
	{
		if (sn.isSC)
		{
			if (st2.find(sn.readName) != st2.end())
				srCo += 1;
			else
				scCo += 1;
		}
	}
	for (SoftNode sn : sc2)
	{
		if (sn.isSC)
		{
			if (st1.find(sn.readName) != st1.end())
				srCo += 1;
			else
				scCo += 1;
		}
	}
	return std::make_pair(srCo, scCo);
}